

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

bool __thiscall Clasp::Solver::backtrack(Solver *this)

{
  size_type sVar1;
  size_type sVar2;
  bool bVar3;
  Literal lastChoiceInverted;
  ImpliedLiteral local_48;
  
  lastChoiceInverted.rep_ = 0;
  do {
    do {
      sVar1 = (this->levels_).super_type.ebo_.size;
      sVar2 = (this->levels_).root;
      if (sVar1 == sVar2) {
        setStopConflict(this);
        goto LAB_00163956;
      }
      lastChoiceInverted.rep_ =
           *(uint *)((long)&((this->assign_).trail.ebo_.buf)->rep_ +
                    (ulong)(uint)(*(int *)((this->levels_).super_type.ebo_.buf + (sVar1 - 1)) << 2))
           & 0xfffffffe ^ 2;
      undoUntil(this,sVar1 - 1,2);
      setBacktrackLevel(this,(this->levels_).super_type.ebo_.size,undo_pop_bt_level);
    } while ((this->conflict_).ebo_.size != 0);
    local_48.lit.rep_ = 0;
    local_48.level = 0;
    bVar3 = force(this,&lastChoiceInverted,(Antecedent *)&local_48);
  } while (!bVar3);
  local_48.level = (this->levels_).super_type.ebo_.size;
  local_48.lit.rep_ = lastChoiceInverted.rep_;
  local_48.ante.super_pair<Clasp::Antecedent,_unsigned_int>.first.data_ = 0;
  local_48.ante.super_pair<Clasp::Antecedent,_unsigned_int>.second = 0xffffffff;
  ImpliedList::add(&this->impliedLits_,local_48.level,&local_48);
LAB_00163956:
  return sVar1 != sVar2;
}

Assistant:

bool Solver::backtrack() {
	Literal lastChoiceInverted;
	do {
		if (decisionLevel() == rootLevel()) {
			setStopConflict();
			return false;
		}
		lastChoiceInverted = ~decision(decisionLevel());
		undoUntil(decisionLevel() - 1, undo_pop_proj_level);
		setBacktrackLevel(decisionLevel(), undo_pop_bt_level);
	} while (hasConflict() || !force(lastChoiceInverted, 0));
	// remember flipped literal for copyGuidingPath()
	impliedLits_.add(decisionLevel(), ImpliedLiteral(lastChoiceInverted, decisionLevel(), 0));
	return true;
}